

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

void CVodeQuadFree(void *cvode_mem)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if ((cvode_mem != (void *)0x0) && (*(int *)((long)cvode_mem + 0x854) != 0)) {
    iVar1 = *(int *)((long)cvode_mem + 0x834);
    N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x268));
    N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x278));
    N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x270));
    N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x280));
    iVar2 = -1;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    for (lVar3 = 0; (long)iVar2 + 1 != lVar3; lVar3 = lVar3 + 1) {
      N_VDestroy(*(undefined8 *)((long)cvode_mem + lVar3 * 8 + 0x200));
    }
    *(long *)((long)cvode_mem + 0x718) =
         *(long *)((long)cvode_mem + 0x718) - *(long *)((long)cvode_mem + 0x708) * ((long)iVar1 + 5)
    ;
    *(long *)((long)cvode_mem + 0x720) =
         *(long *)((long)cvode_mem + 0x720) - ((long)iVar1 + 5) * *(long *)((long)cvode_mem + 0x710)
    ;
    if (*(int *)((long)cvode_mem + 0x850) != 0) {
      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x80));
      *(long *)((long)cvode_mem + 0x718) =
           *(long *)((long)cvode_mem + 0x718) - *(long *)((long)cvode_mem + 0x708);
      *(long *)((long)cvode_mem + 0x720) =
           *(long *)((long)cvode_mem + 0x720) - *(long *)((long)cvode_mem + 0x710);
    }
    *(undefined8 *)((long)cvode_mem + 0x850) = 0;
    *(undefined4 *)((long)cvode_mem + 0x5c) = 0;
  }
  return;
}

Assistant:

void CVodeQuadFree(void* cvode_mem)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) { return; }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_QuadMallocDone)
  {
    cvQuadFreeVectors(cv_mem);
    cv_mem->cv_QuadMallocDone = SUNFALSE;
    cv_mem->cv_quadr          = SUNFALSE;
  }
}